

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O1

GameResult __thiscall Game::getGuess(Game *this)

{
  int iVar1;
  GameResult GVar2;
  int i;
  long lVar3;
  int32_t iVar4;
  int iVar5;
  Game *in_RSI;
  long lVar6;
  vector<int,_std::allocator<int>_> guessedNumbers;
  vector<int,_std::allocator<int>_> local_30;
  
  getGuessedNumbers(&local_30,in_RSI);
  lVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  do {
    iVar1 = (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3];
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar3] == iVar1) {
      iVar5 = iVar5 + 1;
    }
    else {
      lVar6 = 0;
      do {
        if (lVar3 != lVar6) {
          iVar4 = iVar4 + (uint)(iVar1 == local_30.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  GVar2.cows = iVar4;
  GVar2.bulls = iVar5;
  return GVar2;
}

Assistant:

GameResult Game::getGuess()
{
	auto guessedNumbers = getGuessedNumbers();
	auto bulls = 0;
	auto cows = 0;
	for (auto i = 0; i < length; ++i)
	{
		if (guessedNumbers[i] == referenceNumbers[i])
			++bulls;
		else
		{
			for (auto j = 0; j < length; ++j)
			{
				if (j == i)
					continue;
				else if (referenceNumbers[i] == guessedNumbers[j])
					++cows;
			}
		}
	}

	return GameResult(bulls, cows);
}